

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O1

bool __thiscall ON_EmbeddedBitmap::Internal_WriteV5(ON_EmbeddedBitmap *this,ON_BinaryArchive *file)

{
  bool bVar1;
  ON_wString *s;
  ON_UUID *uuid;
  
  bVar1 = ON_BinaryArchive::Write3dmChunkVersion(file,1,1);
  if (bVar1) {
    s = ON_FileReference::FullPath(&(this->super_ON_Bitmap).m_file_reference);
    bVar1 = ON_BinaryArchive::WriteString(file,s);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_buffer_crc32), bVar1)) &&
        (bVar1 = ON_BinaryArchive::WriteInt(file,1), bVar1)) &&
       (bVar1 = ON_BinaryArchive::WriteCompressedBuffer(file,this->m_sizeof_buffer,this->m_buffer),
       bVar1)) {
      uuid = ON_ModelComponent::Id((ON_ModelComponent *)this);
      bVar1 = ON_BinaryArchive::WriteUuid(file,uuid);
      if (bVar1) {
        ON_ModelComponent::Name((ON_ModelComponent *)&stack0xffffffffffffffe0);
        bVar1 = ON_BinaryArchive::WriteString(file,(ON_wString *)&stack0xffffffffffffffe0);
        ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffffe0);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool ON_EmbeddedBitmap::Internal_WriteV5( ON_BinaryArchive& file ) const 
{
  bool rc = false;
  for (;;)
  {
    if (!file.Write3dmChunkVersion(1, 1))
      break;

    if (!file.WriteString( FileReference().FullPath() ) )
      break;

    if (!file.WriteInt(m_buffer_crc32))
      break;

    const int i = 1; // 1 = compressed
    if (!file.WriteInt(i))
      break;

    if (!file.WriteCompressedBuffer(m_sizeof_buffer, m_buffer))
      break;

    // version 1.1 added id and name
    if (!file.WriteUuid(Id()))
      break;
    if (!file.WriteString(Name()))
      break;

    rc = true;
    break;
  }

  return rc;
}